

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

char * __thiscall VPLGrammar::Parser::WhileStatementNode::GetName(WhileStatementNode *this)

{
  return "WhileStatement";
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                int unique_id = scope->GetUnique();

                out << "func .L" << unique_id << "_while\n";
                children_[0]->BuildProgram(scope, out);
                out << "    jz .L" << unique_id << "_end_while\n";

                out << "    pop 0\n";
                children_[1]->BuildProgram(scope, out);
                out << "    jmp .L" << unique_id << "_while\n";
                out << "func .L" << unique_id << "_end_while\n";
                out << "    pop 0\n";
                out << "func .L" << unique_id << "_end\n";
            }